

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_fp16s(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  _func_int *p_Var1;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  void *pvVar8;
  unsigned_short uVar9;
  uint _w;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char cVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  Mat *this_01;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  unsigned_short *puVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint local_f8;
  Mat local_c8;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  p_Var1 = this->_vptr_InnerProduct_x86_fma[-3];
  uVar10 = *(uint *)(&this->field_0xd0 + (long)p_Var1);
  uVar22 = (ulong)uVar10;
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) / (int)uVar10;
  cVar14 = '\x01';
  if (opt->use_packing_layout == true) {
    cVar14 = '\b';
    if ((uVar10 & 7) != 0) {
      cVar14 = ((uVar10 & 3) == 0) * '\x03' + '\x01';
    }
  }
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var1);
  this_00 = &this->weight_data_tm;
  if (cVar14 == '\x01') {
    Mat::reshape(&local_c8,this_01,_w,uVar10,(Allocator *)0x0);
    cast_float32_to_float16(&local_c8,this_00,opt);
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_78 = uVar22;
    if (cVar14 == '\x04') {
      Mat::reshape(&local_c8,this_01,_w,uVar10,(Allocator *)0x0);
      uVar15 = uVar10 + 3;
      if (-1 < (int)uVar10) {
        uVar15 = uVar10;
      }
      Mat::create(this_00,_w,(int)uVar15 >> 2,8,4,(Allocator *)0x0);
      if (3 < (int)uVar10) {
        local_f8 = _w & 0xfffffffc;
        lVar24 = 3;
        lVar28 = 2;
        lVar29 = 1;
        lVar13 = 0;
        uVar22 = 0;
        do {
          pvVar8 = local_c8.data;
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar2 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          pauVar25 = (undefined1 (*) [16])((uVar22 >> 2) * lVar30 * sVar3 + (long)pvVar2);
          lVar31 = (long)local_c8.w;
          if ((int)_w < 4) {
            lVar31 = local_c8.elemsize * lVar31;
            lVar16 = lVar31 * uVar22;
            lVar11 = (uVar22 | 1) * lVar31;
            lVar34 = (uVar22 | 2) * lVar31;
            lVar32 = lVar31 * (uVar22 | 3);
            uVar10 = 0;
          }
          else {
            lVar32 = local_c8.elemsize * lVar24 * lVar31;
            lVar34 = local_c8.elemsize * lVar28 * lVar31;
            lVar11 = local_c8.elemsize * lVar29 * lVar31;
            lVar31 = local_c8.elemsize * uVar22 * lVar31;
            iVar23 = 3;
            lVar16 = 0;
            do {
              pauVar26 = pauVar25;
              auVar36 = *(undefined1 (*) [16])((long)local_c8.data + lVar16 + lVar31);
              auVar38 = *(undefined1 (*) [16])((long)local_c8.data + lVar16 + lVar11);
              auVar40 = *(undefined1 (*) [16])((long)local_c8.data + lVar16 + lVar34);
              auVar41 = *(undefined1 (*) [16])((long)local_c8.data + lVar16 + lVar32);
              auVar5 = vpunpckldq_avx(auVar36,auVar38);
              auVar6 = vpunpckldq_avx(auVar40,auVar41);
              auVar36 = vpunpckhdq_avx(auVar36,auVar38);
              auVar38 = vpunpckhdq_avx(auVar40,auVar41);
              auVar41 = vpunpcklqdq_avx(auVar5,auVar6);
              auVar40 = vpunpckhqdq_avx(auVar5,auVar6);
              auVar5 = vpunpcklqdq_avx(auVar36,auVar38);
              auVar36 = vpunpckhqdq_avx(auVar36,auVar38);
              auVar39._16_16_ = auVar40;
              auVar39._0_16_ = auVar41;
              auVar37._16_16_ = auVar36;
              auVar37._0_16_ = auVar5;
              pauVar25 = (undefined1 (*) [16])((long)pvVar2 + lVar16 * 2 + sVar3 * lVar13 * lVar30);
              auVar36 = vcvtps2ph_f16c(auVar39,3);
              *pauVar25 = auVar36;
              auVar36 = vcvtps2ph_f16c(auVar37,3);
              pauVar25[1] = auVar36;
              iVar23 = iVar23 + 4;
              lVar16 = lVar16 + 0x10;
              pauVar25 = pauVar25 + 2;
            } while (iVar23 < (int)_w);
            pauVar25 = pauVar26 + 2;
            lVar32 = lVar32 + lVar16;
            lVar34 = lVar34 + lVar16;
            lVar11 = lVar11 + lVar16;
            lVar16 = lVar31 + lVar16;
            uVar10 = local_f8;
          }
          if ((int)uVar10 < (int)_w) {
            lVar30 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar16));
              *(unsigned_short *)(*pauVar25 + lVar30 * 8) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar11));
              *(unsigned_short *)(*pauVar25 + lVar30 * 8 + 2) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar34));
              *(unsigned_short *)(*pauVar25 + lVar30 * 8 + 4) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar32));
              *(unsigned_short *)(*pauVar25 + lVar30 * 8 + 6) = uVar9;
              lVar30 = lVar30 + 1;
            } while (_w - uVar10 != (int)lVar30);
          }
          uVar22 = uVar22 + 4;
          lVar24 = lVar24 + 4;
          lVar28 = lVar28 + 4;
          lVar29 = lVar29 + 4;
          lVar13 = lVar13 + 1;
        } while ((int)((uint)uVar22 | 3) < (int)local_78);
      }
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (cVar14 == '\b') {
      Mat::reshape(&local_c8,this_01,_w,uVar10,(Allocator *)0x0);
      uVar15 = uVar10 + 7;
      if (-1 < (int)uVar10) {
        uVar15 = uVar10;
      }
      Mat::create(this_00,_w,(int)uVar15 >> 3,0x10,8,(Allocator *)0x0);
      if (7 < (int)uVar10) {
        lVar13 = 1;
        lVar28 = 2;
        lVar29 = 3;
        lVar30 = 4;
        lVar31 = 5;
        lVar32 = 6;
        lVar24 = 7;
        lVar34 = 0;
        uVar22 = 0;
        do {
          pvVar8 = local_c8.data;
          lVar16 = (long)(this->weight_data_tm).w;
          pvVar2 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          puVar35 = (unsigned_short *)((uVar22 >> 3) * lVar16 * sVar3 + (long)pvVar2);
          lVar11 = (long)local_c8.w;
          if ((int)_w < 8) {
            lVar11 = local_c8.elemsize * lVar11;
            lVar17 = lVar11 * uVar22;
            lVar27 = (uVar22 | 1) * lVar11;
            lVar18 = (uVar22 | 2) * lVar11;
            lVar19 = (uVar22 | 3) * lVar11;
            lVar20 = (uVar22 | 4) * lVar11;
            lVar21 = (uVar22 | 5) * lVar11;
            lVar33 = (uVar22 | 6) * lVar11;
            lVar11 = lVar11 * (uVar22 | 7);
            uVar10 = 0;
          }
          else {
            lVar16 = sVar3 * lVar34 * lVar16;
            lVar17 = local_c8.elemsize * uVar22 * lVar11;
            lVar27 = local_c8.elemsize * lVar13 * lVar11;
            lVar18 = local_c8.elemsize * lVar28 * lVar11;
            lVar19 = local_c8.elemsize * lVar29 * lVar11;
            lVar20 = local_c8.elemsize * lVar30 * lVar11;
            lVar21 = local_c8.elemsize * lVar31 * lVar11;
            lVar33 = local_c8.elemsize * lVar32 * lVar11;
            lVar11 = local_c8.elemsize * lVar24 * lVar11;
            iVar23 = 7;
            lVar12 = 0;
            do {
              auVar36 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar17)
                                       ,3);
              auVar38 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar27)
                                       ,3);
              auVar40 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar18)
                                       ,3);
              auVar41 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar19)
                                       ,3);
              auVar42 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar20)
                                       ,3);
              auVar43 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar21)
                                       ,3);
              auVar44 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar33)
                                       ,3);
              auVar45 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar11)
                                       ,3);
              auVar5 = vpunpcklwd_avx(auVar36,auVar38);
              auVar36 = vpunpckhwd_avx(auVar36,auVar38);
              auVar6 = vpunpcklwd_avx(auVar40,auVar41);
              auVar38 = vpunpckhwd_avx(auVar40,auVar41);
              auVar7 = vpunpcklwd_avx(auVar42,auVar43);
              auVar40 = vpunpckhwd_avx(auVar42,auVar43);
              auVar42 = vpunpcklwd_avx(auVar44,auVar45);
              auVar41 = vpunpckhwd_avx(auVar44,auVar45);
              auVar43 = vpunpckldq_avx(auVar5,auVar6);
              auVar5 = vpunpckhdq_avx(auVar5,auVar6);
              auVar6 = vpunpckldq_avx(auVar36,auVar38);
              auVar36 = vpunpckhdq_avx(auVar36,auVar38);
              auVar44 = vpunpckldq_avx(auVar7,auVar42);
              auVar38 = vpunpckhdq_avx(auVar7,auVar42);
              auVar7 = vpunpckldq_avx(auVar40,auVar41);
              auVar40 = vpunpckhdq_avx(auVar40,auVar41);
              auVar42 = vpunpcklqdq_avx(auVar43,auVar44);
              auVar41 = vpunpckhqdq_avx(auVar43,auVar44);
              auVar43 = vpunpcklqdq_avx(auVar5,auVar38);
              auVar38 = vpunpckhqdq_avx(auVar5,auVar38);
              auVar44 = vpunpcklqdq_avx(auVar6,auVar7);
              auVar5 = vpunpckhqdq_avx(auVar6,auVar7);
              auVar6 = vpunpcklqdq_avx(auVar36,auVar40);
              auVar36 = vpunpckhqdq_avx(auVar36,auVar40);
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16) = auVar42;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x10) = auVar41;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x20) = auVar43;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x30) = auVar38;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x40) = auVar44;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x50) = auVar5;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x60) = auVar6;
              *(undefined1 (*) [16])((long)pvVar2 + lVar12 * 4 + lVar16 + 0x70) = auVar36;
              puVar35 = puVar35 + 0x40;
              lVar12 = lVar12 + 0x20;
              iVar23 = iVar23 + 8;
            } while (iVar23 < (int)_w);
            lVar17 = lVar17 + lVar12;
            lVar27 = lVar27 + lVar12;
            lVar18 = lVar18 + lVar12;
            lVar19 = lVar19 + lVar12;
            lVar20 = lVar20 + lVar12;
            lVar21 = lVar21 + lVar12;
            lVar33 = lVar33 + lVar12;
            lVar11 = lVar11 + lVar12;
            uVar10 = _w & 0xfffffff8;
          }
          local_70 = uVar22;
          local_68 = lVar34;
          local_60 = lVar24;
          local_58 = lVar32;
          local_50 = lVar31;
          local_48 = lVar30;
          local_40 = lVar29;
          local_38 = lVar28;
          if ((int)uVar10 < (int)_w) {
            lVar24 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar17));
              *puVar35 = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar27));
              puVar35[1] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar18));
              puVar35[2] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar19));
              puVar35[3] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar20));
              puVar35[4] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar21));
              puVar35[5] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar33));
              puVar35[6] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar11));
              puVar35[7] = uVar9;
              puVar35 = puVar35 + 8;
              lVar24 = lVar24 + 1;
            } while (_w - uVar10 != (int)lVar24);
          }
          uVar22 = local_70 + 8;
          lVar34 = local_68 + 1;
          lVar13 = lVar13 + 8;
          lVar28 = local_38 + 8;
          lVar29 = local_40 + 8;
          lVar30 = local_48 + 8;
          lVar31 = local_50 + 8;
          lVar32 = local_58 + 8;
          lVar24 = local_60 + 8;
        } while ((int)((uint)uVar22 | 7) < (int)local_78);
      }
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var1 = this->_vptr_InnerProduct_x86_fma[-3];
    piVar4 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var1) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var1));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined1 (*) [16])(&this->field_0x13c + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x130 + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x158 + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}